

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O2

int yaml_emitter_analyze_tag(yaml_emitter_t *emitter,yaml_char_t *tag)

{
  yaml_tag_directive_t *pyVar1;
  yaml_char_t *pyVar2;
  int iVar3;
  size_t sVar4;
  size_t __n;
  size_t sVar5;
  yaml_tag_directive_t *pyVar6;
  
  sVar4 = strlen((char *)tag);
  if (sVar4 == 0) {
    emitter->error = YAML_EMITTER_ERROR;
    emitter->problem = "tag value must not be empty";
    iVar3 = 0;
  }
  else {
    pyVar1 = (emitter->tag_directives).top;
    for (pyVar6 = (emitter->tag_directives).start; pyVar6 != pyVar1; pyVar6 = pyVar6 + 1) {
      pyVar2 = pyVar6->prefix;
      __n = strlen((char *)pyVar2);
      if (__n <= sVar4 && sVar4 - __n != 0) {
        iVar3 = strncmp((char *)pyVar2,(char *)tag,__n);
        if (iVar3 == 0) {
          pyVar2 = pyVar6->handle;
          (emitter->tag_data).handle = pyVar2;
          sVar5 = strlen((char *)pyVar2);
          (emitter->tag_data).handle_length = sVar5;
          (emitter->tag_data).suffix = tag + __n;
          (emitter->tag_data).suffix_length = sVar4 - __n;
          goto LAB_0010ab64;
        }
      }
    }
    (emitter->tag_data).suffix = tag;
    (emitter->tag_data).suffix_length = sVar4;
LAB_0010ab64:
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int
yaml_emitter_analyze_tag(yaml_emitter_t *emitter,
        yaml_char_t *tag)
{
    size_t tag_length;
    yaml_string_t string;
    yaml_tag_directive_t *tag_directive;

    tag_length = strlen((char *)tag);
    STRING_ASSIGN(string, tag, tag_length);

    if (string.start == string.end) {
        return yaml_emitter_set_emitter_error(emitter,
                "tag value must not be empty");
    }

    for (tag_directive = emitter->tag_directives.start;
            tag_directive != emitter->tag_directives.top; tag_directive ++) {
        size_t prefix_length = strlen((char *)tag_directive->prefix);
        if (prefix_length < (size_t)(string.end - string.start)
                && strncmp((char *)tag_directive->prefix, (char *)string.start,
                    prefix_length) == 0)
        {
            emitter->tag_data.handle = tag_directive->handle;
            emitter->tag_data.handle_length =
                strlen((char *)tag_directive->handle);
            emitter->tag_data.suffix = string.start + prefix_length;
            emitter->tag_data.suffix_length =
                (string.end - string.start) - prefix_length;
            return 1;
        }
    }

    emitter->tag_data.suffix = string.start;
    emitter->tag_data.suffix_length = string.end - string.start;

    return 1;
}